

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_geom_buf.cxx
# Opt level: O2

void __thiscall xray_re::xr_vbuf::xr_vbuf(xr_vbuf *this,xr_vbuf *that)

{
  size_t sVar1;
  undefined7 uVar2;
  _vector3<float> *p_Var3;
  _vector2<float> *p_Var4;
  _color<float> *p_Var5;
  _influence<unsigned_int,_float> *p_Var6;
  
  (this->super_xr_flexbuf)._vptr_xr_flexbuf = (_func_int **)&PTR__xr_flexbuf_00238900;
  uVar2 = *(undefined7 *)&(that->super_xr_flexbuf).field_0x9;
  sVar1 = (that->super_xr_flexbuf).m_size;
  (this->super_xr_flexbuf).m_owner = (that->super_xr_flexbuf).m_owner;
  *(undefined7 *)&(this->super_xr_flexbuf).field_0x9 = uVar2;
  (this->super_xr_flexbuf).m_size = sVar1;
  (this->super_xr_flexbuf)._vptr_xr_flexbuf = (_func_int **)&PTR__xr_vbuf_00238858;
  (this->super_xr_flexbuf).m_owner = true;
  (this->super_xr_flexbuf).m_size = (that->super_xr_flexbuf).m_size;
  p_Var3 = xr_flexbuf::duplicate<xray_re::_vector3<float>>(&this->super_xr_flexbuf,that->m_points);
  this->m_points = p_Var3;
  p_Var3 = xr_flexbuf::duplicate<xray_re::_vector3<float>>(&this->super_xr_flexbuf,that->m_normals);
  this->m_normals = p_Var3;
  p_Var4 = xr_flexbuf::duplicate<xray_re::_vector2<float>>
                     (&this->super_xr_flexbuf,that->m_texcoords);
  this->m_texcoords = p_Var4;
  p_Var4 = xr_flexbuf::duplicate<xray_re::_vector2<float>>
                     (&this->super_xr_flexbuf,that->m_lightmaps);
  this->m_lightmaps = p_Var4;
  p_Var5 = xr_flexbuf::duplicate<xray_re::_color<float>>(&this->super_xr_flexbuf,that->m_colors);
  this->m_colors = p_Var5;
  p_Var6 = xr_flexbuf::duplicate<xray_re::_influence<unsigned_int,float>>
                     (&this->super_xr_flexbuf,that->m_influences);
  this->m_influences = p_Var6;
  make_signature(this);
  return;
}

Assistant:

xr_vbuf::xr_vbuf(const xr_vbuf& that): xr_flexbuf(that)
{
	set_owner(true);
	set_size(that.size());
	m_points = duplicate(that.m_points);
	m_normals = duplicate(that.m_normals);
	m_texcoords = duplicate(that.m_texcoords);
	m_lightmaps = duplicate(that.m_lightmaps);
	m_colors = duplicate(that.m_colors);
	m_influences = duplicate(that.m_influences);
	make_signature();
}